

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::evalSubscriptMat4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = (c->coords).m_data[0];
  fVar2 = (c->coords).m_data[1];
  fVar3 = (c->coords).m_data[2];
  fVar4 = (c->coords).m_data[3];
  (c->color).m_data[0] = fVar4 * 0.125 + fVar3 * 0.25 + fVar2 * 0.5 + fVar1;
  (c->color).m_data[1] = fVar1 * 0.125 + fVar4 * 0.25 + fVar3 * 0.5 + fVar2;
  (c->color).m_data[2] = fVar2 * 0.125 + fVar1 * 0.25 + fVar4 * 0.5 + fVar3;
  (c->color).m_data[3] = fVar3 * 0.125 + fVar2 * 0.25 + fVar1 * 0.5 + fVar4;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }